

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

void tt_done_blend(TT_Face face)

{
  uint uVar1;
  GX_Blend P;
  FT_Memory memory;
  GX_MVarTable P_00;
  GX_AVarTable pGVar2;
  GX_AVarSegment P_01;
  long lVar3;
  
  P = face->blend;
  if (P != (GX_Blend)0x0) {
    memory = (face->root).memory;
    uVar1 = P->mmvar->num_axis;
    ft_mem_free(memory,P->coords);
    P->coords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->normalizedcoords);
    P->normalizedcoords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->normalized_stylecoords);
    P->normalized_stylecoords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->mmvar);
    P->mmvar = (FT_MM_Var *)0x0;
    pGVar2 = P->avar_table;
    if (pGVar2 != (GX_AVarTable)0x0) {
      P_01 = pGVar2->avar_segment;
      if (P_01 != (GX_AVarSegment)0x0) {
        for (lVar3 = 0; (ulong)uVar1 << 4 != lVar3; lVar3 = lVar3 + 0x10) {
          ft_mem_free(memory,*(void **)((long)&P_01->correspondence + lVar3));
          P_01 = P->avar_table->avar_segment;
          *(undefined8 *)((long)&P_01->correspondence + lVar3) = 0;
        }
        ft_mem_free(memory,P_01);
        pGVar2 = P->avar_table;
        pGVar2->avar_segment = (GX_AVarSegment)0x0;
      }
      tt_var_done_item_variation_store(face,&pGVar2->itemStore);
      tt_var_done_delta_set_index_map(face,&P->avar_table->axisMap);
      ft_mem_free(memory,P->avar_table);
      P->avar_table = (GX_AVarTable)0x0;
    }
    if (P->hvar_table != (GX_HVVarTable)0x0) {
      tt_var_done_item_variation_store(face,&P->hvar_table->itemStore);
      tt_var_done_delta_set_index_map(face,&P->hvar_table->widthMap);
      ft_mem_free(memory,P->hvar_table);
      P->hvar_table = (GX_HVVarTable)0x0;
    }
    if (P->vvar_table != (GX_HVVarTable)0x0) {
      tt_var_done_item_variation_store(face,&P->vvar_table->itemStore);
      tt_var_done_delta_set_index_map(face,&P->vvar_table->widthMap);
      ft_mem_free(memory,P->vvar_table);
      P->vvar_table = (GX_HVVarTable)0x0;
    }
    if (P->mvar_table != (GX_MVarTable)0x0) {
      tt_var_done_item_variation_store(face,&P->mvar_table->itemStore);
      ft_mem_free(memory,P->mvar_table->values);
      P_00 = P->mvar_table;
      P_00->values = (GX_Value)0x0;
      ft_mem_free(memory,P_00);
      P->mvar_table = (GX_MVarTable)0x0;
    }
    ft_mem_free(memory,P->tuplecoords);
    P->tuplecoords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->glyphoffsets);
    P->glyphoffsets = (FT_ULong *)0x0;
    ft_mem_free(memory,P);
    return;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_done_blend( TT_Face  face )
  {
    FT_Memory  memory = FT_FACE_MEMORY( face );
    GX_Blend   blend  = face->blend;


    if ( blend )
    {
      FT_UInt  i, num_axes;


      /* blend->num_axis might not be set up yet */
      num_axes = blend->mmvar->num_axis;

      FT_FREE( blend->coords );
      FT_FREE( blend->normalizedcoords );
      FT_FREE( blend->normalized_stylecoords );
      FT_FREE( blend->mmvar );

      if ( blend->avar_table )
      {
        if ( blend->avar_table->avar_segment )
        {
          for ( i = 0; i < num_axes; i++ )
            FT_FREE( blend->avar_table->avar_segment[i].correspondence );
          FT_FREE( blend->avar_table->avar_segment );
        }

        tt_var_done_item_variation_store( face,
                                          &blend->avar_table->itemStore );

        tt_var_done_delta_set_index_map( face,
                                         &blend->avar_table->axisMap );

        FT_FREE( blend->avar_table );
      }

      if ( blend->hvar_table )
      {
        tt_var_done_item_variation_store( face,
                                          &blend->hvar_table->itemStore );

        tt_var_done_delta_set_index_map( face,
                                         &blend->hvar_table->widthMap );
        FT_FREE( blend->hvar_table );
      }

      if ( blend->vvar_table )
      {
        tt_var_done_item_variation_store( face,
                                          &blend->vvar_table->itemStore );

        tt_var_done_delta_set_index_map( face,
                                         &blend->vvar_table->widthMap );
        FT_FREE( blend->vvar_table );
      }

      if ( blend->mvar_table )
      {
        tt_var_done_item_variation_store( face,
                                          &blend->mvar_table->itemStore );

        FT_FREE( blend->mvar_table->values );
        FT_FREE( blend->mvar_table );
      }

      FT_FREE( blend->tuplecoords );
      FT_FREE( blend->glyphoffsets );
      FT_FREE( blend );
    }
  }